

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

bool __thiscall
cmake::FindPackage(cmake *this,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *args)

{
  unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *this_00;
  string_view sVar1;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> _Var2;
  pointer __s;
  byte bVar3;
  bool bVar4;
  pointer this_01;
  pointer pcVar5;
  string *psVar6;
  undefined8 uVar7;
  pointer this_02;
  undefined8 uVar8;
  cmTarget *this_03;
  cmGeneratorTarget *this_04;
  basic_string_view<char,_std::char_traits<char>_> bVar9;
  cmOutputConverter *local_920;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_720;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_700;
  cmStateSnapshot local_6e0;
  cmStateDirectory local_6c8;
  undefined1 local_6a0 [8];
  cmLinkLineComputer linkLineComputer;
  cmLocalGenerator *lg_1;
  cmGeneratorTarget *gtgt;
  string linkFlags;
  string flags;
  string linkPath;
  string frameworkPath;
  string linkLibs;
  allocator<char> local_589;
  string local_588;
  undefined1 local_568 [8];
  string buildType;
  string *lib;
  iterator __end5;
  iterator __begin5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range5;
  undefined1 local_518 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  libList;
  string local_4f8;
  string local_4d8 [8];
  string libs;
  string local_4b0;
  allocator<char> local_489;
  string local_488;
  cmTarget *local_468;
  cmTarget *tgt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srcs;
  char *targetName;
  allocator<char> local_409;
  string local_408;
  string local_3e8 [8];
  string definitions;
  undefined1 local_3a8 [8];
  string includeFlags;
  value_type *lg;
  undefined1 local_370 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includeDirs;
  string local_350;
  string local_330 [8];
  string includes;
  allocator<char> local_2a9;
  string local_2a8;
  byte local_282;
  allocator<char> local_281;
  undefined1 local_280 [6];
  bool quiet;
  byte local_25a;
  allocator<char> local_259;
  undefined1 local_258 [6];
  bool packageFound;
  string local_238 [8];
  string packageName;
  string local_210;
  string local_1f0 [8];
  string mode;
  string local_1c8;
  undefined1 local_1a8 [8];
  string language;
  string local_180;
  undefined1 local_160 [8];
  string systemFile;
  cmMakefile *mf;
  unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> local_128;
  __single_object mfu;
  cmStateDirectory local_100;
  string local_d8;
  cmStateDirectory local_b8;
  undefined1 local_90 [8];
  cmStateSnapshot snapshot;
  unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> local_70;
  string local_68;
  string local_38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmake *this_local;
  
  local_18 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  SetHomeDirectory(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  SetHomeOutputDirectory(this,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  snapshot.Position.Position = (PositionType)this;
  std::make_unique<cmGlobalGenerator,cmake*>((cmake **)&local_70);
  SetGlobalGenerator(this,&local_70);
  std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::~unique_ptr
            (&local_70);
  GetCurrentSnapshot((cmStateSnapshot *)local_90,this);
  cmStateSnapshot::GetDirectory(&local_b8,(cmStateSnapshot *)local_90);
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  cmStateDirectory::SetCurrentBinary(&local_b8,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  cmStateSnapshot::GetDirectory(&local_100,(cmStateSnapshot *)local_90);
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  cmStateDirectory::SetCurrentSource(&local_100,(string *)&mfu);
  std::__cxx11::string::~string((string *)&mfu);
  cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)local_90);
  mf = (cmMakefile *)GetGlobalGenerator(this);
  std::make_unique<cmMakefile,cmGlobalGenerator*,cmStateSnapshot&>
            ((cmGlobalGenerator **)&local_128,(cmStateSnapshot *)&mf);
  this_01 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::get(&local_128);
  pcVar5 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::operator->
                     (&this->GlobalGenerator);
  this_00 = (unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)
            ((long)&systemFile.field_2 + 8);
  std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::unique_ptr(this_00,&local_128);
  cmGlobalGenerator::AddMakefile(pcVar5,this_00);
  std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::~unique_ptr
            ((unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)
             ((long)&systemFile.field_2 + 8));
  cmMakefile::SetArgcArgv(this_01,local_18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"CMakeFindPackageMode.cmake",
             (allocator<char> *)(language.field_2._M_local_buf + 0xf));
  cmMakefile::GetModulesFile((string *)local_160,this_01,&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator((allocator<char> *)(language.field_2._M_local_buf + 0xf));
  cmMakefile::ReadListFile(this_01,(string *)local_160);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"LANGUAGE",(allocator<char> *)(mode.field_2._M_local_buf + 0xf));
  psVar6 = cmMakefile::GetSafeDefinition(this_01,&local_1c8);
  std::__cxx11::string::string((string *)local_1a8,(string *)psVar6);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)(mode.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"MODE",(allocator<char> *)(packageName.field_2._M_local_buf + 0xf)
            );
  psVar6 = cmMakefile::GetSafeDefinition(this_01,&local_210);
  std::__cxx11::string::string(local_1f0,(string *)psVar6);
  std::__cxx11::string::~string((string *)&local_210);
  std::allocator<char>::~allocator((allocator<char> *)(packageName.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_258,"NAME",&local_259);
  psVar6 = cmMakefile::GetSafeDefinition(this_01,(string *)local_258);
  std::__cxx11::string::string(local_238,(string *)psVar6);
  std::__cxx11::string::~string((string *)local_258);
  std::allocator<char>::~allocator(&local_259);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_280,"PACKAGE_FOUND",&local_281)
  ;
  bVar4 = cmMakefile::IsOn(this_01,(string *)local_280);
  std::__cxx11::string::~string((string *)local_280);
  std::allocator<char>::~allocator(&local_281);
  local_25a = bVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,"PACKAGE_QUIET",&local_2a9);
  bVar4 = cmMakefile::IsOn(this_01,&local_2a8);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  local_282 = bVar4;
  if ((local_25a & 1) == 0) {
    if (!bVar4) {
      uVar7 = std::__cxx11::string::c_str();
      printf("%s not found.\n",uVar7);
    }
  }
  else {
    _Var2 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
            std::__cxx11::string::operator_cast_to_basic_string_view(local_1f0);
    bVar9 = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("EXIST",5);
    bVar4 = std::operator==(_Var2,bVar9);
    if (bVar4) {
      if ((local_282 & 1) == 0) {
        uVar7 = std::__cxx11::string::c_str();
        printf("%s found.\n",uVar7);
      }
    }
    else {
      _Var2 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
              std::__cxx11::string::operator_cast_to_basic_string_view(local_1f0);
      bVar9 = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("COMPILE",7);
      includes.field_2._8_8_ = bVar9._M_len;
      bVar4 = std::operator==(_Var2,bVar9);
      if (bVar4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_350,"PACKAGE_INCLUDE_DIRS",
                   (allocator<char> *)
                   ((long)&includeDirs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        psVar6 = cmMakefile::GetSafeDefinition(this_01,&local_350);
        std::__cxx11::string::string(local_330,(string *)psVar6);
        std::__cxx11::string::~string((string *)&local_350);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&includeDirs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        sVar1 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_330);
        cmExpandedList_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_370,sVar1,false);
        pcVar5 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::
                 operator->(&this->GlobalGenerator);
        cmGlobalGenerator::CreateGenerationObjects(pcVar5,AllTargets);
        pcVar5 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::
                 operator->(&this->GlobalGenerator);
        includeFlags.field_2._8_8_ =
             std::
             vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
             ::operator[](&pcVar5->LocalGenerators,0);
        this_02 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::
                  operator->((unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> *
                             )includeFlags.field_2._8_8_);
        std::__cxx11::string::string((string *)(definitions.field_2._M_local_buf + 8));
        cmLocalGenerator::GetIncludeFlags
                  ((string *)local_3a8,this_02,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_370,(cmGeneratorTarget *)0x0,(string *)local_1a8,
                   (string *)(definitions.field_2._M_local_buf + 8),false);
        std::__cxx11::string::~string((string *)(definitions.field_2._M_local_buf + 8));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_408,"PACKAGE_DEFINITIONS",&local_409);
        psVar6 = cmMakefile::GetSafeDefinition(this_01,&local_408);
        std::__cxx11::string::string(local_3e8,(string *)psVar6);
        std::__cxx11::string::~string((string *)&local_408);
        std::allocator<char>::~allocator(&local_409);
        uVar7 = std::__cxx11::string::c_str();
        uVar8 = std::__cxx11::string::c_str();
        printf("%s %s\n",uVar7,uVar8);
        std::__cxx11::string::~string(local_3e8);
        std::__cxx11::string::~string((string *)local_3a8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_370);
        std::__cxx11::string::~string(local_330);
      }
      else {
        _Var2 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                std::__cxx11::string::operator_cast_to_basic_string_view(local_1f0);
        bVar9 = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("LINK",4);
        bVar4 = std::operator==(_Var2,bVar9);
        if (bVar4) {
          srcs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0xc42472;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&tgt);
          __s = srcs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_488,(char *)__s,&local_489);
          this_03 = cmMakefile::AddExecutable
                              (this_01,&local_488,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&tgt,true);
          std::__cxx11::string::~string((string *)&local_488);
          std::allocator<char>::~allocator(&local_489);
          local_468 = this_03;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4b0,"LINKER_LANGUAGE",
                     (allocator<char> *)(libs.field_2._M_local_buf + 0xf));
          cmTarget::SetProperty(this_03,&local_4b0,(string *)local_1a8);
          std::__cxx11::string::~string((string *)&local_4b0);
          std::allocator<char>::~allocator((allocator<char> *)(libs.field_2._M_local_buf + 0xf));
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4f8,"PACKAGE_LIBRARIES",
                     (allocator<char> *)
                     ((long)&libList.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          psVar6 = cmMakefile::GetSafeDefinition(this_01,&local_4f8);
          std::__cxx11::string::string(local_4d8,(string *)psVar6);
          std::__cxx11::string::~string((string *)&local_4f8);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&libList.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          sVar1 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_4d8);
          cmExpandedList_abi_cxx11_
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_518,sVar1,false);
          __end5 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_518);
          lib = (string *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_518);
          while (bVar4 = __gnu_cxx::operator!=
                                   (&__end5,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             *)&lib), bVar4) {
            buildType.field_2._8_8_ =
                 __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end5);
            cmTarget::AddLinkLibrary
                      (local_468,this_01,(string *)buildType.field_2._8_8_,GENERAL_LibraryType);
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&__end5);
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_588,"CMAKE_BUILD_TYPE",&local_589);
          psVar6 = cmMakefile::GetSafeDefinition(this_01,&local_588);
          std::__cxx11::string::string((string *)local_568,(string *)psVar6);
          std::__cxx11::string::~string((string *)&local_588);
          std::allocator<char>::~allocator(&local_589);
          cmsys::SystemTools::UpperCase((string *)((long)&linkLibs.field_2 + 8),(string *)local_568)
          ;
          std::__cxx11::string::operator=
                    ((string *)local_568,(string *)(linkLibs.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(linkLibs.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)(frameworkPath.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)(linkPath.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)(flags.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)(linkFlags.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)&gtgt);
          pcVar5 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::
                   operator->(&this->GlobalGenerator);
          cmGlobalGenerator::CreateGenerationObjects(pcVar5,AllTargets);
          pcVar5 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::
                   operator->(&this->GlobalGenerator);
          psVar6 = cmTarget::GetName_abi_cxx11_(local_468);
          this_04 = cmGlobalGenerator::FindGeneratorTarget(pcVar5,psVar6);
          linkLineComputer._56_8_ = cmGeneratorTarget::GetLocalGenerator(this_04);
          local_920 = (cmOutputConverter *)0x0;
          if ((cmLocalGenerator *)linkLineComputer._56_8_ != (cmLocalGenerator *)0x0) {
            local_920 = &((cmLocalGenerator *)linkLineComputer._56_8_)->super_cmOutputConverter;
          }
          cmLocalGenerator::GetStateSnapshot(&local_6e0,(cmLocalGenerator *)linkLineComputer._56_8_)
          ;
          cmStateSnapshot::GetDirectory(&local_6c8,&local_6e0);
          cmLinkLineComputer::cmLinkLineComputer
                    ((cmLinkLineComputer *)local_6a0,local_920,&local_6c8);
          cmLocalGenerator::GetTargetFlags
                    ((cmLocalGenerator *)linkLineComputer._56_8_,(cmLinkLineComputer *)local_6a0,
                     (string *)local_568,(string *)((long)&frameworkPath.field_2 + 8),
                     (string *)((long)&linkFlags.field_2 + 8),(string *)&gtgt,
                     (string *)((long)&linkPath.field_2 + 8),(string *)((long)&flags.field_2 + 8),
                     this_04);
          std::operator+(&local_720,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&linkPath.field_2 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&flags.field_2 + 8));
          std::operator+(&local_700,&local_720,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&frameworkPath.field_2 + 8));
          std::__cxx11::string::operator=
                    ((string *)(frameworkPath.field_2._M_local_buf + 8),(string *)&local_700);
          std::__cxx11::string::~string((string *)&local_700);
          std::__cxx11::string::~string((string *)&local_720);
          uVar7 = std::__cxx11::string::c_str();
          printf("%s\n",uVar7);
          cmLinkLineComputer::~cmLinkLineComputer((cmLinkLineComputer *)local_6a0);
          std::__cxx11::string::~string((string *)&gtgt);
          std::__cxx11::string::~string((string *)(linkFlags.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(flags.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(linkPath.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(frameworkPath.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)local_568);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_518);
          std::__cxx11::string::~string(local_4d8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&tgt);
        }
      }
    }
  }
  bVar3 = local_25a;
  std::__cxx11::string::~string(local_238);
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::string::~string((string *)local_1a8);
  std::__cxx11::string::~string((string *)local_160);
  std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::~unique_ptr(&local_128);
  return (bool)(bVar3 & 1);
}

Assistant:

bool cmake::FindPackage(const std::vector<std::string>& args)
{
  this->SetHomeDirectory(cmSystemTools::GetCurrentWorkingDirectory());
  this->SetHomeOutputDirectory(cmSystemTools::GetCurrentWorkingDirectory());

  this->SetGlobalGenerator(cm::make_unique<cmGlobalGenerator>(this));

  cmStateSnapshot snapshot = this->GetCurrentSnapshot();
  snapshot.GetDirectory().SetCurrentBinary(
    cmSystemTools::GetCurrentWorkingDirectory());
  snapshot.GetDirectory().SetCurrentSource(
    cmSystemTools::GetCurrentWorkingDirectory());
  // read in the list file to fill the cache
  snapshot.SetDefaultDefinitions();
  auto mfu = cm::make_unique<cmMakefile>(this->GetGlobalGenerator(), snapshot);
  cmMakefile* mf = mfu.get();
  this->GlobalGenerator->AddMakefile(std::move(mfu));

  mf->SetArgcArgv(args);

  std::string systemFile = mf->GetModulesFile("CMakeFindPackageMode.cmake");
  mf->ReadListFile(systemFile);

  std::string language = mf->GetSafeDefinition("LANGUAGE");
  std::string mode = mf->GetSafeDefinition("MODE");
  std::string packageName = mf->GetSafeDefinition("NAME");
  bool packageFound = mf->IsOn("PACKAGE_FOUND");
  bool quiet = mf->IsOn("PACKAGE_QUIET");

  if (!packageFound) {
    if (!quiet) {
      printf("%s not found.\n", packageName.c_str());
    }
  } else if (mode == "EXIST"_s) {
    if (!quiet) {
      printf("%s found.\n", packageName.c_str());
    }
  } else if (mode == "COMPILE"_s) {
    std::string includes = mf->GetSafeDefinition("PACKAGE_INCLUDE_DIRS");
    std::vector<std::string> includeDirs = cmExpandedList(includes);

    this->GlobalGenerator->CreateGenerationObjects();
    const auto& lg = this->GlobalGenerator->LocalGenerators[0];
    std::string includeFlags =
      lg->GetIncludeFlags(includeDirs, nullptr, language, std::string());

    std::string definitions = mf->GetSafeDefinition("PACKAGE_DEFINITIONS");
    printf("%s %s\n", includeFlags.c_str(), definitions.c_str());
  } else if (mode == "LINK"_s) {
    const char* targetName = "dummy";
    std::vector<std::string> srcs;
    cmTarget* tgt = mf->AddExecutable(targetName, srcs, true);
    tgt->SetProperty("LINKER_LANGUAGE", language);

    std::string libs = mf->GetSafeDefinition("PACKAGE_LIBRARIES");
    std::vector<std::string> libList = cmExpandedList(libs);
    for (std::string const& lib : libList) {
      tgt->AddLinkLibrary(*mf, lib, GENERAL_LibraryType);
    }

    std::string buildType = mf->GetSafeDefinition("CMAKE_BUILD_TYPE");
    buildType = cmSystemTools::UpperCase(buildType);

    std::string linkLibs;
    std::string frameworkPath;
    std::string linkPath;
    std::string flags;
    std::string linkFlags;
    this->GlobalGenerator->CreateGenerationObjects();
    cmGeneratorTarget* gtgt =
      this->GlobalGenerator->FindGeneratorTarget(tgt->GetName());
    cmLocalGenerator* lg = gtgt->GetLocalGenerator();
    cmLinkLineComputer linkLineComputer(lg,
                                        lg->GetStateSnapshot().GetDirectory());
    lg->GetTargetFlags(&linkLineComputer, buildType, linkLibs, flags,
                       linkFlags, frameworkPath, linkPath, gtgt);
    linkLibs = frameworkPath + linkPath + linkLibs;

    printf("%s\n", linkLibs.c_str());

    /*    if ( use_win32 )
          {
          tgt->SetProperty("WIN32_EXECUTABLE", "ON");
          }
        if ( use_macbundle)
          {
          tgt->SetProperty("MACOSX_BUNDLE", "ON");
          }*/
  }

  return packageFound;
}